

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O2

void moveToFreeBindingList(XML_Parser parser,BINDING *bindings)

{
  binding *pbVar1;
  
  while (bindings != (BINDING *)0x0) {
    pbVar1 = bindings->nextTagBinding;
    bindings->nextTagBinding = parser->m_freeBindingList;
    parser->m_freeBindingList = bindings;
    bindings = pbVar1;
  }
  return;
}

Assistant:

static void FASTCALL
moveToFreeBindingList(XML_Parser parser, BINDING *bindings)
{
  while (bindings) {
    BINDING *b = bindings;
    bindings = bindings->nextTagBinding;
    b->nextTagBinding = freeBindingList;
    freeBindingList = b;
  }
}